

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall
google::protobuf::RepeatedField<bool>::RepeatedField
          (RepeatedField<bool> *this,RepeatedField<bool> *other)

{
  LogMessage *pLVar1;
  bool *__dest;
  bool *__src;
  LogMessage local_a0;
  LogMessage local_68;
  LogFinisher local_29;
  
  this->current_size_ = 0;
  this->total_size_ = 0;
  this->arena_or_elements_ = (void *)0x0;
  if (other->current_size_ != 0) {
    Reserve(this,other->current_size_);
    AddNAlreadyReserved(this,other->current_size_);
    if (this->current_size_ < 1) {
      internal::LogMessage::LogMessage
                (&local_a0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/repeated_field.h"
                 ,0x526);
      pLVar1 = internal::LogMessage::operator<<
                         (&local_a0,"CHECK failed: (index) < (current_size_): ");
      internal::LogFinisher::operator=((LogFinisher *)&local_68,pLVar1);
      internal::LogMessage::~LogMessage(&local_a0);
    }
    __dest = elements(this);
    if (other->current_size_ < 1) {
      internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/repeated_field.h"
                 ,0x511);
      pLVar1 = internal::LogMessage::operator<<
                         (&local_68,"CHECK failed: (index) < (current_size_): ");
      internal::LogFinisher::operator=(&local_29,pLVar1);
      internal::LogMessage::~LogMessage(&local_68);
    }
    __src = elements(other);
    memcpy(__dest,__src,(long)other->current_size_);
  }
  return;
}

Assistant:

inline RepeatedField<Element>::RepeatedField(const RepeatedField& other)
    : current_size_(0), total_size_(0), arena_or_elements_(nullptr) {
  if (other.current_size_ != 0) {
    Reserve(other.size());
    AddNAlreadyReserved(other.size());
    CopyArray(Mutable(0), &other.Get(0), other.size());
  }
}